

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_impl<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  char cVar1;
  string_view tag_00;
  string_view full_tag_00;
  string_view tag_01;
  string_view full_tag_01;
  string_view tag_02;
  string_view full_tag_02;
  string_view tag_03;
  string_view full_tag_03;
  bool bVar2;
  runtime_error *this;
  const_reference pcVar3;
  char *in_RCX;
  ToStringVisitor *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  char *in_R8;
  ToStringVisitor *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  Range *in_stack_00000048;
  ToStringVisitor *in_stack_00000050;
  string_view in_stack_00000058;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string_view *in_stack_ffffffffffffff18;
  Range *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  Range *in_stack_ffffffffffffff88;
  ToStringVisitor *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Range *in_stack_ffffffffffffffa0;
  ToStringVisitor *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb7;
  Range *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Range *in_stack_ffffffffffffffc8;
  int max_recursion_00;
  undefined4 uVar4;
  
  max_recursion_00 = (int)in_RDI;
  uVar4 = (undefined4)((ulong)in_RDI >> 0x20);
  if (in_stack_00000008 != 0) {
    bVar2 = string_view::empty((string_view *)&stack0xffffffffffffffe0);
    if (!bVar2) {
      pcVar3 = string_view::front((string_view *)&stack0xffffffffffffffe0);
      cVar1 = *pcVar3;
      if (cVar1 == '(') {
        tag_00._len._4_4_ = uVar4;
        tag_00._len._0_4_ = max_recursion_00;
        full_tag_00._len = in_stack_ffffffffffffff60;
        full_tag_00._ptr = in_RSI;
        tag_00._ptr = in_RCX;
        visit_tuple<binlog::ToStringVisitor,binlog::Range>
                  (full_tag_00,tag_00,in_RDX,in_stack_ffffffffffffff38,in_stack_ffffffffffffff70);
      }
      else if (cVar1 == '/') {
        visit_enum<binlog::ToStringVisitor,binlog::Range>
                  (in_stack_00000058,in_stack_00000050,in_stack_00000048);
      }
      else if (cVar1 == '<') {
        full_tag_01._len._0_7_ = in_stack_ffffffffffffffb0;
        full_tag_01._ptr = (char *)in_stack_ffffffffffffffa8;
        full_tag_01._len._7_1_ = in_stack_ffffffffffffffb7;
        tag_01._len = (size_t)in_stack_ffffffffffffffa0;
        tag_01._ptr = in_stack_ffffffffffffff98;
        visit_variant<binlog::ToStringVisitor,binlog::Range>
                  (full_tag_01,tag_01,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffffc0);
      }
      else if (cVar1 == '[') {
        full_tag_02._len = (size_t)in_RDX;
        full_tag_02._ptr = in_R8;
        tag_02._len = (size_t)in_R9;
        tag_02._ptr = (char *)in_stack_ffffffffffffffc8;
        visit_sequence<binlog::ToStringVisitor,binlog::Range>
                  (full_tag_02,tag_02,
                   (ToStringVisitor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,max_recursion_00);
      }
      else if (cVar1 == '{') {
        full_tag_03._len._0_4_ = max_recursion_00;
        full_tag_03._ptr = in_RCX;
        full_tag_03._len._4_4_ = uVar4;
        tag_03._len = (size_t)in_RDX;
        tag_03._ptr = in_R8;
        visit_struct<binlog::ToStringVisitor,binlog::Range>
                  (full_tag_03,tag_03,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
      }
      else {
        string_view::front((string_view *)&stack0xffffffffffffffe0);
        visit_arithmetic<binlog::ToStringVisitor,binlog::Range>
                  (in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  string_view::to_string_abi_cxx11_(in_stack_ffffffffffffff18);
  std::operator+((char *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffb0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}